

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_texture2d * rf_load_texture_from_image_with_mipmaps(rf_mipmaps_image image)

{
  uint uVar1;
  rf_texture2d *in_RDI;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  rf_pixel_format in_stack_00000018;
  char in_stack_0000001c;
  int in_stack_00000020;
  
  in_RDI->id = 0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  in_RDI->valid = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  if (in_stack_0000001c == '\x01') {
    uVar1 = rf_gfx_load_texture(in_stack_00000008,in_stack_00000010,in_stack_00000014,
                                in_stack_00000018,in_stack_00000020);
    in_RDI->id = uVar1;
    if (uVar1 != 0) {
      in_RDI->width = in_stack_00000010;
      in_RDI->height = in_stack_00000014;
      in_RDI->format = in_stack_00000018;
      in_RDI->valid = true;
    }
  }
  else {
    rf_log_impl(4,0x17d438);
  }
  return in_RDI;
}

Assistant:

RF_API rf_texture2d rf_load_texture_from_image_with_mipmaps(rf_mipmaps_image image)
{
    rf_texture2d result = {0};

    if (image.valid)
    {
        result.id = rf_gfx_load_texture(image.data, image.width, image.height, image.format, image.mipmaps);

        if (result.id != 0)
        {
            result.width  = image.width;
            result.height = image.height;
            result.format = image.format;
            result.valid  = true;
        }
    }
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture could not be loaded from rf_image");

    return result;
}